

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

uchar MemGetByte(uint address)

{
  CDeviceSlot *pCVar1;
  int local_1c;
  int i;
  CDeviceSlot *S;
  uint address_local;
  
  if ((DeviceID != (char *)0x0) && (pass == 3)) {
    for (local_1c = 0; local_1c < Device->SlotsCount; local_1c = local_1c + 1) {
      pCVar1 = CDevice::GetSlot(Device,local_1c);
      if (((uint)pCVar1->Address <= address) && (address < (uint)(pCVar1->Address + pCVar1->Size)))
      {
        return pCVar1->Page->RAM[address - pCVar1->Address];
      }
    }
    ErrorInt("MemGetByte: Error reading address",address,PASS3);
  }
  return '\0';
}

Assistant:

unsigned char MemGetByte(unsigned int address) {
	if (!DeviceID || pass != LASTPASS) {
		return 0;
	}

	CDeviceSlot* S;
	for (int i=0;i<Device->SlotsCount;i++) {
		S = Device->GetSlot(i);
		if (address >= (unsigned int)S->Address  && address < (unsigned int)S->Address + (unsigned int)S->Size) {
			return S->Page->RAM[address - S->Address];
		}
	}

	ErrorInt("MemGetByte: Error reading address", address);
	return 0;
}